

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O2

bool __thiscall protozero::pbf_reader::get_bool(pbf_reader *this)

{
  char cVar1;
  assert_error *this_00;
  
  if (this->m_tag == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before accessing field value\"")
    ;
  }
  else {
    if (this->m_wire_type == varint) {
      cVar1 = *this->m_data;
      skip_varint(&this->m_data,this->m_end);
      return cVar1 != '\0';
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"has_wire_type(pbf_wire_type::varint) && \"not a varint\"");
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool get_bool() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        protozero_assert(has_wire_type(pbf_wire_type::varint) && "not a varint");
        const bool result = m_data[0] != 0;
        skip_varint(&m_data, m_end);
        return result;
    }